

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_adapter.c
# Opt level: O0

size_t UNIT_conv_string_to_letter_utf8(char *s,MAFSA_letter *l,size_t sz_l)

{
  size_t pos;
  u_char *i;
  size_t sz_l_local;
  MAFSA_letter *l_local;
  char *s_local;
  
  pos = 0;
  i = (u_char *)s;
  do {
    if (*i == '\0' || sz_l <= pos) {
      return pos;
    }
    if (*i == '\'') {
      l[pos] = '\x1b';
    }
    else if (*i == '-') {
      l[pos] = '\x1a';
    }
    else if ((*i < 0x41) || (0x5a < *i)) {
      if (*i < 0x61) {
        return pos;
      }
      if (0x7a < *i) {
        return pos;
      }
      l[pos] = *i + 0x9f;
    }
    else {
      l[pos] = *i + 0xbf;
    }
    i = i + 1;
    pos = pos + 1;
  } while( true );
}

Assistant:

size_t UNIT_conv_string_to_letter_utf8(const char *s, MAFSA_letter *l, size_t sz_l)
{
    const u_char *i = (const u_char *) s;
    size_t pos = 0;
    while (*i && pos < sz_l)
    {
        if (i[0] == '\'')
        {
            l[pos] = UNIT_LETTER_APOSTROPHE;
        }
        else if (i[0] == '-')
        {
            l[pos] = UNIT_LETTER_DIFFIS;
        }
        else
        {
            if ((i[0] >= 'A') && (i[0] <= 'Z'))
            {
                l[pos] = (MAFSA_letter) (i[0] - 'A');
            }
            else if ((i[0] >= 'a') && (i[0] <= 'z'))
            {
                l[pos] = (MAFSA_letter) (i[0] - 'a');
            }
            else
            {
                return pos;
            }
        }
        ++i;
        ++pos;
    }
    return pos;
}